

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_raw<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,initializer_list<int> *simplex,
          Filtration_value *filtration)

{
  undefined8 *puVar1;
  Vertex_handle v;
  uint uVar2;
  initializer_list<int> *piVar3;
  ulong uVar4;
  uint *puVar5;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar6;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar7;
  __buckets_ptr local_40;
  char local_38;
  
  piVar3 = simplex + 4;
  v = (Vertex_handle)piVar3;
  puVar5 = (uint *)*filtration;
  if (puVar5 != puVar5 + (long)filtration[1] + -1) {
    do {
      if (*puVar5 == (uint)simplex[3]._M_len) goto LAB_0010abe3;
      insert_node_<false,true,false,double_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0,
                 (Siblings *)simplex,(Vertex_handle)piVar3,(double *)(ulong)*puVar5);
      piVar3 = (initializer_list<int> *)local_40[3];
      v = (Vertex_handle)piVar3;
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint *)((long)*filtration + (long)filtration[1] * 4 + -4));
  }
  if (*puVar5 != (uint)simplex[3]._M_len) {
    pVar6 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0
                       ,(Siblings *)simplex,v,(double *)(ulong)*puVar5);
    uVar4 = pVar6._8_8_;
    if (local_38 == '\x01') {
      uVar2 = *(int *)(filtration + 1) - 1;
      uVar4 = (ulong)uVar2;
      if (*(int *)&simplex[8]._M_array < (int)uVar2) {
        *(uint *)&simplex[8]._M_array = uVar2;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar7._8_8_ = uVar4;
    pVar7.first.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
    return pVar7;
  }
LAB_0010abe3:
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }